

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

int __thiscall
EnvironmentNAVXYTHETALAT::GetGoalHeuristic(EnvironmentNAVXYTHETALAT *this,int stateID)

{
  value_type pEVar1;
  int iVar2;
  reference ppEVar3;
  int in_ESI;
  long *in_RDI;
  double dVar4;
  int hEuclid;
  int h2D;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  int local_2c;
  
  ppEVar3 = std::
            vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
            operator[]((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                        *)(in_RDI + 0x34),(long)in_ESI);
  pEVar1 = *ppEVar3;
  iVar2 = SBPL2DGridSearch::getlowerboundoncostfromstart_inmm
                    ((SBPL2DGridSearch *)in_RDI[0x31],pEVar1->X,pEVar1->Y);
  dVar4 = (double)(**(code **)(*in_RDI + 0x250))
                            (in_RDI,pEVar1->X,pEVar1->Y,(int)in_RDI[8],
                             *(undefined4 *)((long)in_RDI + 0x44));
  local_2c = (int)(dVar4 * 1000.0);
  if (local_2c < iVar2) {
    local_2c = iVar2;
  }
  return (int)((double)local_2c / (double)in_RDI[0x12]);
}

Assistant:

int EnvironmentNAVXYTHETALAT::GetGoalHeuristic(int stateID)
{
#if USE_HEUR==0
    return 0;
#endif

#if DEBUG
    if (stateID >= (int)StateID2CoordTable.size()) {
        throw SBPL_Exception("ERROR in EnvNAVXYTHETALAT... function: stateID illegal");
    }
#endif

    EnvNAVXYTHETALATHashEntry_t* HashEntry = StateID2CoordTable[stateID];
    // computes distances from start state that is grid2D, so it is EndX_c EndY_c
    int h2D = grid2Dsearchfromgoal->getlowerboundoncostfromstart_inmm(HashEntry->X, HashEntry->Y);
    int hEuclid = (int)(NAVXYTHETALAT_COSTMULT_MTOMM *
            EuclideanDistance_m(HashEntry->X, HashEntry->Y, EnvNAVXYTHETALATCfg.EndX_c, EnvNAVXYTHETALATCfg.EndY_c));

    // define this function if it is used in the planner (heuristic backward search would use it)
    return (int)(((double)__max(h2D, hEuclid)) / EnvNAVXYTHETALATCfg.nominalvel_mpersecs);
}